

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

Ray * __thiscall CMU462::Camera::generate_ray(Camera *this,double x,double y)

{
  Camera *in_RSI;
  Ray *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  Camera *this_00;
  double y_00;
  double in_XMM1_Qa;
  Vector3D direction;
  Vector3D p;
  Vector3D origin;
  Matrix4x4 trans;
  double W;
  double H;
  double v_fov_rad;
  Matrix4x4 *in_stack_00000738;
  Ray *this_01;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  Vector3D *in_stack_fffffffffffffe40;
  Vector3D *in_stack_fffffffffffffe48;
  Ray *in_stack_fffffffffffffe50;
  Vector3D *in_stack_fffffffffffffe70;
  Matrix4x4 *in_stack_fffffffffffffe78;
  Vector3D local_180;
  double local_168;
  double local_160;
  double local_158;
  Vector3D local_150;
  undefined1 local_138 [128];
  undefined1 local_b8 [128];
  double local_38;
  double local_30;
  
  this_01 = in_RDI;
  dVar1 = v_fov(in_RSI);
  this_00 = (Camera *)((dVar1 / 180.0) * 3.141592653589793);
  local_30 = tan((double)this_00 / 2.0);
  local_38 = aspect_ratio(in_RSI);
  local_38 = local_38 * local_30;
  dVar1 = (in_XMM0_Qa / 0.5) * local_38;
  y_00 = (in_XMM1_Qa / 0.5) * local_30;
  getTransformation(this_00);
  Matrix4x4::inv(in_stack_00000738);
  memcpy(local_b8,local_138,0x80);
  Vector3D::Vector3D(&local_150,0.0,0.0,0.0);
  Matrix4x4::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  local_150.x = local_168;
  local_150.y = local_160;
  local_150.z = local_158;
  Vector3D::Vector3D(&local_180,dVar1,y_00,-1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  Vector3D::operator-((Vector3D *)this_01,(Vector3D *)in_RSI);
  Vector3D::unit((Vector3D *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  Ray::Ray(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
           in_stack_fffffffffffffe3c);
  return in_RDI;
}

Assistant:

Ray Camera::generate_ray(double x, double y) {
	// TODO (PathTracer):
	// compute position of the input sensor sample coordinate on the
	// canonical sensor plane one unit away from the pinhole.
	double v_fov_rad = v_fov() / 180.0*PI;
	double H = tan(v_fov_rad / 2);
	double W = aspect_ratio() * H;

	x = x / 0.5* W;
	y = y / 0.5* H;

	Matrix4x4 trans = getTransformation();
	trans = trans.inv();

	Vector3D origin(0, 0, 0);
	origin = trans * origin;

	Vector3D p(x, y, -1);
	p = trans * p;

	Vector3D direction = p - origin;

	return Ray(origin, direction.unit());
}